

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O2

void rep0_ctx_recv(void *arg,nni_aio *aio)

{
  __pthread_list_t *list;
  nni_mtx *mtx;
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  undefined8 *item;
  nni_msg *m;
  size_t sVar4;
  void *__src;
  nni_aio *aio_00;
  
  mtx = *arg;
  nni_mtx_lock(mtx);
  list = &mtx[2].mtx.__data.__list;
  item = (undefined8 *)nni_list_first((nni_list *)list);
  if (item != (undefined8 *)0x0) {
    aio_00 = (nni_aio *)(item + 0x3c);
    m = nni_aio_get_msg(aio_00);
    nni_aio_set_msg(aio_00,(nni_msg *)0x0);
    nni_list_remove((nni_list *)list,item);
    iVar2 = nni_list_empty((nni_list *)list);
    if (iVar2 != 0) {
      nni_pollable_clear((nni_pollable *)((long)&mtx[7].mtx + 0x10));
    }
    nni_pipe_recv((nni_pipe *)*item,aio_00);
    if (((void *)((long)&mtx[3].mtx + 0x20) == arg) && (*(char *)(item + 0x7a) == '\0')) {
      nni_pollable_raise((nni_pollable *)&mtx[7].mtx.__data.__list.__next);
    }
    sVar4 = nni_msg_header_len(m);
    __src = nni_msg_header(m);
    memcpy((void *)((long)arg + 0x50),__src,sVar4);
    *(size_t *)((long)arg + 0x48) = sVar4;
    uVar3 = nni_pipe_id((nni_pipe *)*item);
    *(uint32_t *)((long)arg + 8) = uVar3;
    nni_mtx_unlock(mtx);
    nni_msg_header_clear(m);
    nni_aio_set_msg(aio,m);
    sVar4 = nni_msg_len(m);
    nni_aio_finish(aio,NNG_OK,sVar4);
    return;
  }
  _Var1 = nni_aio_start(aio,rep0_cancel_recv,arg);
  if (_Var1) {
    if (*(long *)((long)arg + 0x20) != 0) {
      nni_mtx_unlock(mtx);
      nni_aio_finish_error(aio,NNG_ESTATE);
      return;
    }
    *(nni_aio **)((long)arg + 0x20) = aio;
    nni_list_append((nni_list *)((long)&mtx[3].mtx + 8),arg);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
rep0_ctx_recv(void *arg, nni_aio *aio)
{
	rep0_ctx  *ctx = arg;
	rep0_sock *s   = ctx->sock;
	rep0_pipe *p;
	size_t     len;
	nni_msg   *msg;

	nni_mtx_lock(&s->lk);
	if ((p = nni_list_first(&s->recvpipes)) == NULL) {
		if (!nni_aio_start(aio, rep0_cancel_recv, ctx)) {
			nni_mtx_unlock(&s->lk);
			return;
		}
		if (ctx->raio != NULL) {
			// Cannot have a second receive operation pending.
			// This could be ESTATE, or we could cancel the first
			// with ECANCELED.  We elect the former.
			nni_mtx_unlock(&s->lk);
			nni_aio_finish_error(aio, NNG_ESTATE);
			return;
		}
		ctx->raio = aio;
		nni_list_append(&s->recvq, ctx);
		nni_mtx_unlock(&s->lk);
		return;
	}
	msg = nni_aio_get_msg(&p->aio_recv);
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_list_remove(&s->recvpipes, p);
	if (nni_list_empty(&s->recvpipes)) {
		nni_pollable_clear(&s->readable);
	}
	nni_pipe_recv(p->pipe, &p->aio_recv);
	if ((ctx == &s->ctx) && !p->busy) {
		nni_pollable_raise(&s->writable);
	}

	len = nni_msg_header_len(msg);
	memcpy(ctx->btrace, nni_msg_header(msg), len);
	ctx->btrace_len = len;
	ctx->pipe_id    = nni_pipe_id(p->pipe);
	nni_mtx_unlock(&s->lk);

	nni_msg_header_clear(msg);
	nni_aio_set_msg(aio, msg);
	nni_aio_finish(aio, 0, nni_msg_len(msg));
}